

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O1

void __thiscall
testing::internal::MatcherBase<const_phmap::priv::(anonymous_namespace)::StringTable_&>::
~MatcherBase(MatcherBase<const_phmap::priv::(anonymous_namespace)::StringTable_&> *this)

{
  ~MatcherBase(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

~MatcherBase() override { Destroy(); }